

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

int Abc_NtkMfs(Abc_Ntk_t *pNtk,Mfs_Par_t *pPars)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  Mfs_Man_t *p_00;
  Vec_Int_t *pVVar8;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pAVar9;
  Bdc_Man_t *pBVar10;
  Abc_Obj_t *pAVar11;
  ProgressBar *pPVar12;
  Vec_Vec_t *p_01;
  Vec_Ptr_t *pVVar13;
  abctime aVar14;
  float fVar15;
  int local_9c;
  Abc_Ntk_t *pTemp;
  int nTotalEdgesBeg;
  int nTotalNodesBeg;
  abctime clk2;
  abctime clk;
  int nFaninMax;
  int nNodes;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Vec_Vec_t *vLevels;
  Abc_Obj_t *pObj;
  Mfs_Man_t *p;
  ProgressBar *pProgress;
  Bdc_Par_t *pDecPars;
  undefined4 local_28;
  Bdc_Par_t Pars;
  Mfs_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  Pars._4_8_ = pPars;
  memset((void *)((long)&pDecPars + 4),0,0xc);
  aVar7 = Abc_Clock();
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar2 = Abc_NtkGetTotalFanins(pNtk);
  iVar3 = Abc_NtkIsLogic(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsCore.c"
                  ,0x188,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
  }
  clk._0_4_ = Abc_NtkGetFaninMax(pNtk);
  if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
    if (0xc < (int)clk) {
      printf("Nodes with more than %d fanins will not be processed.\n");
      clk._0_4_ = 0xc;
    }
  }
  else if (8 < (int)clk) {
    printf("Nodes with more than %d fanins will not be processed.\n");
    clk._0_4_ = 8;
  }
  iVar3 = Abc_NtkToAig(pNtk);
  if (iVar3 == 0) {
    fprintf(_stdout,"Converting to AIGs has failed.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    iVar3 = Abc_NtkHasAig(pNtk);
    if (iVar3 == 0) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsCore.c"
                    ,0x1a2,"int Abc_NtkMfs(Abc_Ntk_t *, Mfs_Par_t *)");
    }
    p_00 = Mfs_ManAlloc((Mfs_Par_t *)Pars._4_8_);
    p_00->pNtk = pNtk;
    p_00->nFaninMax = (int)clk;
    if (*(int *)(Pars._4_8_ + 0x34) != 0) {
      if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
        pVVar8 = Abc_NtkPowerEstimate(pNtk,1);
        p_00->vProbs = pVVar8;
      }
      else {
        pVVar8 = Abc_NtkPowerEstimate(pNtk,0);
        p_00->vProbs = pVVar8;
      }
      fVar15 = Abc_NtkMfsTotalSwitching(pNtk);
      p_00->TotalSwitchingBeg = fVar15;
    }
    if (pNtk->pExcare != (void *)0x0) {
      iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare);
      iVar4 = Abc_NtkCiNum(pNtk);
      if (iVar3 == iVar4) {
        pNtk_00 = Abc_NtkStrash((Abc_Ntk_t *)pNtk->pExcare,0,0,0);
        pAVar9 = Abc_NtkToDar(pNtk_00,0,0);
        p_00->pCare = pAVar9;
        Abc_NtkDelete(pNtk_00);
        pVVar13 = Aig_ManSupportsInverse(p_00->pCare);
        p_00->vSuppsInv = pVVar13;
      }
      else {
        uVar5 = Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare);
        uVar6 = Abc_NtkCiNum(pNtk);
        printf("The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n",
               (ulong)uVar5,(ulong)uVar6);
      }
    }
    if (p_00->pCare != (Aig_Man_t *)0x0) {
      uVar5 = Aig_ManCoNum(p_00->pCare);
      printf("Performing optimization with %d external care clauses.\n",(ulong)uVar5);
    }
    if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
      if ((int)clk < 3) {
        local_9c = 3;
      }
      else {
        local_9c = (int)clk;
      }
      pDecPars._4_4_ = local_9c;
      local_28 = *(undefined4 *)(Pars._4_8_ + 0x3c);
      pVVar8 = Vec_IntAlloc(0);
      p_00->vTruth = pVVar8;
      pBVar10 = Bdc_ManAlloc((Bdc_Par_t *)((long)&pDecPars + 4));
      p_00->pManDec = pBVar10;
    }
    if (p_00->pCare != (Aig_Man_t *)0x0) {
      for (nNodes = 0; iVar3 = Abc_NtkCiNum(pNtk), nNodes < iVar3; nNodes = nNodes + 1) {
        pAVar11 = Abc_NtkCi(pNtk,nNodes);
        pAVar11->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)nNodes;
      }
    }
    Abc_NtkLevel(pNtk);
    Abc_NtkStartReverseLevels(pNtk,*(int *)(Pars._4_8_ + 0x10));
    clk._4_4_ = 0;
    p_00->nTotalNodesBeg = iVar1;
    p_00->nTotalEdgesBeg = iVar2;
    pFile = _stdout;
    if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
      iVar1 = Abc_NtkNodeNum(pNtk);
      pPVar12 = Extra_ProgressBarStart((FILE *)pFile,iVar1);
      p_01 = Abc_NtkLevelize(pNtk);
      for (nFaninMax = 1; iVar1 = Vec_VecSize(p_01), nFaninMax < iVar1; nFaninMax = nFaninMax + 1) {
        pVVar13 = Vec_VecEntry(p_01,nFaninMax);
        if (p_00->pPars->fVeryVerbose == 0) {
          Extra_ProgressBarUpdate(pPVar12,clk._4_4_,(char *)0x0);
        }
        p_00->nNodesGainedLevel = 0;
        p_00->nTotConfLevel = 0;
        p_00->nTimeOutsLevel = 0;
        Abc_Clock();
        nNodes = 0;
        while ((iVar1 = Vec_PtrSize(pVVar13), nNodes < iVar1 &&
               ((pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar13,nNodes), p_00->pPars->nDepthMax == 0 ||
                ((int)(*(uint *)&pAVar11->field_0x14 >> 0xc) <= p_00->pPars->nDepthMax))))) {
          iVar1 = Abc_ObjFaninNum(pAVar11);
          if ((1 < iVar1) && (iVar1 = Abc_ObjFaninNum(pAVar11), iVar1 <= (int)clk)) {
            if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
              Abc_NtkMfsNode(p_00,pAVar11);
            }
            else {
              Abc_NtkMfsResub(p_00,pAVar11);
            }
          }
          nNodes = nNodes + 1;
        }
        iVar1 = Vec_PtrSize(pVVar13);
        clk._4_4_ = iVar1 + clk._4_4_;
      }
      Extra_ProgressBarStop(pPVar12);
      Vec_VecFree(p_01);
    }
    else if (*(int *)(Pars._4_8_ + 0x34) == 0) {
      iVar1 = Abc_NtkObjNumMax(pNtk);
      pPVar12 = Extra_ProgressBarStart((FILE *)pFile,iVar1);
      for (nNodes = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nNodes < iVar1; nNodes = nNodes + 1) {
        pAVar11 = Abc_NtkObj(pNtk,nNodes);
        if ((((pAVar11 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar11), iVar1 != 0)) &&
            ((p_00->pPars->nDepthMax == 0 ||
             ((int)(*(uint *)&pAVar11->field_0x14 >> 0xc) <= p_00->pPars->nDepthMax)))) &&
           ((iVar1 = Abc_ObjFaninNum(pAVar11), 1 < iVar1 &&
            (iVar1 = Abc_ObjFaninNum(pAVar11), iVar1 <= (int)clk)))) {
          if (p_00->pPars->fVeryVerbose == 0) {
            Extra_ProgressBarUpdate(pPVar12,nNodes,(char *)0x0);
          }
          if (*(int *)(Pars._4_8_ + 0x1c) == 0) {
            Abc_NtkMfsNode(p_00,pAVar11);
          }
          else {
            Abc_NtkMfsResub(p_00,pAVar11);
          }
        }
      }
      Extra_ProgressBarStop(pPVar12);
    }
    else {
      Abc_NtkMfsPowerResub(p_00,(Mfs_Par_t *)Pars._4_8_);
    }
    Abc_NtkStopReverseLevels(pNtk);
    iVar1 = Abc_NtkNodeNum(pNtk);
    p_00->nTotalNodesEnd = iVar1;
    iVar1 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalEdgesEnd = iVar1;
    if (p_00->pCare != (Aig_Man_t *)0x0) {
      for (nNodes = 0; iVar1 = Abc_NtkCiNum(pNtk), nNodes < iVar1; nNodes = nNodes + 1) {
        pAVar11 = Abc_NtkCi(pNtk,nNodes);
        (pAVar11->field_5).pData = (void *)0x0;
      }
    }
    if (*(int *)(Pars._4_8_ + 0x34) != 0) {
      fVar15 = Abc_NtkMfsTotalSwitching(pNtk);
      p_00->TotalSwitchingEnd = fVar15;
    }
    aVar14 = Abc_Clock();
    p_00->timeTotal = aVar14 - aVar7;
    Mfs_ManStop(p_00);
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkMfs( Abc_Ntk_t * pNtk, Mfs_Par_t * pPars )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );

    Bdc_Par_t Pars = {0}, * pDecPars = &Pars;
    ProgressBar * pProgress;
    Mfs_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    Vec_Ptr_t * vNodes;
    int i, k, nNodes, nFaninMax;
    abctime clk = Abc_Clock(), clk2;
    int nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    int nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);

    assert( Abc_NtkIsLogic(pNtk) );
    nFaninMax = Abc_NtkGetFaninMax(pNtk);
    if ( pPars->fResub )
    {
        if ( nFaninMax > 8 )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", 8 );
            nFaninMax = 8;
        }
    }
    else
    {
        if ( nFaninMax > MFS_FANIN_MAX )
        {
            printf( "Nodes with more than %d fanins will not be processed.\n", MFS_FANIN_MAX );
            nFaninMax = MFS_FANIN_MAX;
        }
    }
    // perform the network sweep
//    Abc_NtkSweep( pNtk, 0 );
    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIGs has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // start the manager
    p = Mfs_ManAlloc( pPars );
    p->pNtk = pNtk;
    p->nFaninMax = nFaninMax;

    // precomputer power-aware metrics
    if ( pPars->fPower )
    {
        extern Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne );
        if ( pPars->fResub )
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
        else
            p->vProbs = Abc_NtkPowerEstimate( pNtk, 1 );
#if 0
        printf( "Total switching before = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
		p->TotalSwitchingBeg = Abc_NtkMfsTotalSwitching(pNtk);
#endif
    }

    if ( pNtk->pExcare )
    {
        Abc_Ntk_t * pTemp;
        if ( Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare) != Abc_NtkCiNum(pNtk) )
            printf( "The PI count of careset (%d) and logic network (%d) differ. Careset is not used.\n",
                Abc_NtkPiNum((Abc_Ntk_t *)pNtk->pExcare), Abc_NtkCiNum(pNtk) );
        else
        {
            pTemp = Abc_NtkStrash( (Abc_Ntk_t *)pNtk->pExcare, 0, 0, 0 );
            p->pCare = Abc_NtkToDar( pTemp, 0, 0 );
            Abc_NtkDelete( pTemp );
            p->vSuppsInv = Aig_ManSupportsInverse( p->pCare );
        }
    }
    if ( p->pCare != NULL )
        printf( "Performing optimization with %d external care clauses.\n", Aig_ManCoNum(p->pCare) );
    // prepare the BDC manager
    if ( !pPars->fResub )
    {
        pDecPars->nVarsMax = (nFaninMax < 3) ? 3 : nFaninMax;
        pDecPars->fVerbose = pPars->fVerbose;
        p->vTruth = Vec_IntAlloc( 0 );
        p->pManDec = Bdc_ManAlloc( pDecPars );
    }

    // label the register outputs
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = (void *)(ABC_PTRUINT_T)i;
    }

    // compute levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // compute don't-cares for each node
    nNodes = 0;
    p->nTotalNodesBeg = nTotalNodesBeg;
    p->nTotalEdgesBeg = nTotalEdgesBeg;
    if ( pPars->fResub )
    {
#if 0
        printf( "TotalSwitching (%7.2f --> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
		if (pPars->fPower)
		{
			Abc_NtkMfsPowerResub( p, pPars);
		} else
		{
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                continue;
            if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                continue;
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            if ( pPars->fResub )
                Abc_NtkMfsResub( p, pObj );
            else
                Abc_NtkMfsNode( p, pObj );
        }
        Extra_ProgressBarStop( pProgress );
#if 0
        printf( " %7.2f )\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
	} else
    {
#if 0
        printf( "Total switching before  = %7.2f,  ----> ", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
        pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
        vLevels = Abc_NtkLevelize( pNtk );
        Vec_VecForEachLevelStart( vLevels, vNodes, k, 1 )
        {
            if ( !p->pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, nNodes, NULL );
            p->nNodesGainedLevel = 0;
            p->nTotConfLevel = 0;
            p->nTimeOutsLevel = 0;
            clk2 = Abc_Clock();
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                if ( p->pPars->nDepthMax && (int)pObj->Level > p->pPars->nDepthMax )
                    break;
                if ( Abc_ObjFaninNum(pObj) < 2 || Abc_ObjFaninNum(pObj) > nFaninMax )
                    continue;
                if ( pPars->fResub )
                    Abc_NtkMfsResub( p, pObj );
                else
                    Abc_NtkMfsNode( p, pObj );
            }
            nNodes += Vec_PtrSize(vNodes);
            if ( pPars->fVerbose )
            {
				/*
            printf( "Lev = %2d. Node = %5d. Ave gain = %5.2f. Ave conf = %5.2f. T/o = %6.2f %%  ",
                k, Vec_PtrSize(vNodes),
                1.0*p->nNodesGainedLevel/Vec_PtrSize(vNodes),
                1.0*p->nTotConfLevel/Vec_PtrSize(vNodes),
                100.0*p->nTimeOutsLevel/Vec_PtrSize(vNodes) );
            ABC_PRT( "Time", Abc_Clock() - clk2 );
			*/
            }
        }
        Extra_ProgressBarStop( pProgress );
        Vec_VecFree( vLevels );
#if 0
        printf( " %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
    }
    Abc_NtkStopReverseLevels( pNtk );

    // perform the sweeping
    if ( !pPars->fResub )
    {
        extern void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose );
//        Abc_NtkSweep( pNtk, 0 );
//        Abc_NtkBidecResyn( pNtk, 0 );
    }

    p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);

    // undo labesl
    if ( p->pCare )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pData = NULL;
    }

    if ( pPars->fPower )
	{
#if 1
		p->TotalSwitchingEnd = Abc_NtkMfsTotalSwitching(pNtk);
//        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#else
        printf( "Total switching after  = %7.2f.\n", Abc_NtkMfsTotalSwitching(pNtk) );
#endif
	}

    // free the manager
    p->timeTotal = Abc_Clock() - clk;
    Mfs_ManStop( p );
    return 1;
}